

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Texture2D * LoadTexture(Texture2D *__return_storage_ptr__,char *fileName)

{
  Image image_00;
  Image image;
  Image local_28;
  
  __return_storage_ptr__->id = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  LoadImage(&local_28,fileName);
  if (local_28.data != (void *)0x0) {
    image_00.width = local_28.width;
    image_00.height = local_28.height;
    image_00.data = local_28.data;
    image_00.mipmaps = local_28.mipmaps;
    image_00.format = local_28.format;
    LoadTextureFromImage(image_00);
    free(local_28.data);
  }
  return __return_storage_ptr__;
}

Assistant:

Texture2D LoadTexture(const char *fileName)
{
    Texture2D texture = { 0 };

    Image image = LoadImage(fileName);

    if (image.data != NULL)
    {
        texture = LoadTextureFromImage(image);
        UnloadImage(image);
    }

    return texture;
}